

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.hpp
# Opt level: O0

PointType __thiscall
Curve<3,_2>::atWithArcLengthParameterized
          (Curve<3,_2> *this,double *t,int *derivative_order,int *max_iter_time,double *arc_length_t
          )

{
  double dVar1;
  double dVar2;
  bool bVar3;
  anon_class_8_1_8991fb9c *derivative_func;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this_00;
  double in_R9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  PointType PVar5;
  double denominator;
  double numerator;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_b8 [16];
  RealScalar local_a8;
  double second_order;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_98 [16];
  RealScalar local_88;
  double first_order;
  double d;
  double local_70;
  double local_68;
  double approx_length;
  anon_class_8_1_8991fb9c aStack_58;
  int iter;
  anon_class_8_1_8991fb9c df;
  double prev_approx_t;
  double target_length;
  double approx_t;
  double *arc_length_t_local;
  int *max_iter_time_local;
  int *derivative_order_local;
  double *t_local;
  Curve<3,_2> *this_local;
  
  dVar4 = 0.0;
  bVar3 = false;
  if (0.0 <= *(double *)derivative_order) {
    bVar3 = *(double *)derivative_order <= 1.0;
  }
  arc_length_t_local = arc_length_t;
  max_iter_time_local = max_iter_time;
  derivative_order_local = derivative_order;
  t_local = t;
  this_local = this;
  if (!bVar3) {
    __assert_fail("t >= 0.0 && t <= 1.0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/curve.hpp"
                  ,0xad,
                  "virtual PointType Curve<>::atWithArcLengthParameterized(const double &, const int &, const int &, double *) const [N = 3, PointDim = 2]"
                 );
  }
  target_length = *(double *)derivative_order;
  dVar1 = *(double *)derivative_order;
  dVar2 = t[1];
  aStack_58.this = (Curve<3,_2> *)t;
  approx_t = in_R9;
  for (approx_length._4_4_ = 0; df.this = (Curve<3,_2> *)target_length,
      approx_length._4_4_ < *(int *)arc_length_t_local;
      approx_length._4_4_ = approx_length._4_4_ + 1) {
    local_70 = 0.0;
    d = 0.0001;
    derivative_func = &stack0xffffffffffffffa8;
    local_68 = NumericalQuadrature::
               adaptive_simpson_3_8<Curve<3,2>::atWithArcLengthParameterized(double_const&,int_const&,int_const&,double*)const::_lambda(double)_1_const&>
                         (derivative_func,&local_70,&target_length,&d);
    first_order = local_68 - dVar1 * dVar2;
    std::abs((int)derivative_func);
    dVar4 = extraout_XMM0_Qa;
    if (extraout_XMM0_Qa < 1e-06) break;
    second_order._4_4_ = 1;
    (**(code **)((long)*t + 0x10))(local_98,t,&target_length,(long)&second_order + 4);
    local_88 = Eigen::MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::norm(local_98);
    numerator._4_4_ = 2;
    (**(code **)((long)*t + 0x10))(local_b8,t,&target_length,(long)&numerator + 4);
    this_00 = local_b8;
    local_a8 = Eigen::MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::norm(this_00);
    target_length =
         target_length - (first_order * local_88) / (first_order * local_a8 + local_88 * local_88);
    std::abs((int)this_00);
    dVar4 = extraout_XMM0_Qa_00;
    if (extraout_XMM0_Qa_00 < 1e-06) break;
  }
  if (approx_t != 0.0) {
    *(double *)approx_t = target_length;
  }
  PVar5.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       (double)(**(code **)((long)*t + 0x10))(this,t,&target_length,max_iter_time_local);
  PVar5.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       dVar4;
  return (PointType)
         PVar5.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array;
}

Assistant:

virtual auto atWithArcLengthParameterized(const double& t,
                                            const int& derivative_order = 0,
                                            const int& max_iter_time = 4,
                                            double* arc_length_t = nullptr) const -> PointType {
    assert(t >= 0.0 && t <= 1.0);

    double approx_t = t;
    double target_length = t * this->length_;
    double prev_approx_t = approx_t;

    const auto df = [&](double t) -> double { return this->at(t, 1).norm(); };

    for (int iter = 0; iter < max_iter_time; ++iter) {
      double approx_length = NumericalQuadrature::adaptive_simpson_3_8(df, 0, approx_t);
      double d = approx_length - target_length;
      if (abs(d) < EPS) {
        break;
      }

      // Newton's method
      double first_order = this->at(approx_t, 1).norm();
      double second_order = this->at(approx_t, 2).norm();
      double numerator = d * first_order;
      double denominator = d * second_order + first_order * first_order;

      approx_t = approx_t - numerator / denominator;

      if (abs(approx_t - prev_approx_t) < EPS) {
        {
          break;
        }
      } else {
        { prev_approx_t = approx_t; }
      }
    }
    if (arc_length_t != nullptr) {
      *arc_length_t = approx_t;
    }

    return this->at(approx_t, derivative_order);
  }